

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

void Search::generate_training_example
               (search_private *priv,polylabel *losses,float weight,bool add_conditioning,
               float min_loss)

{
  uint64_t *puVar1;
  int iVar2;
  example *peVar3;
  uchar *puVar4;
  wclass *pwVar5;
  size_t sVar6;
  ulong uVar7;
  bool bVar8;
  wclass *pwVar9;
  multi_learner *pmVar10;
  label_t lVar11;
  single_learner *psVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  uint32_t uVar17;
  int iVar18;
  uint uVar19;
  search_private *psVar20;
  ulong uVar21;
  ulong uVar22;
  example *ec;
  multi_ex tmp;
  ulong local_a8;
  label_t local_98;
  label_t lStack_90;
  label_t local_88;
  size_t sStack_80;
  size_t local_78;
  ulong local_70;
  uint64_t local_68;
  ulong local_60;
  wclass local_58;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  if (priv->cb_learner == true) {
    if ((min_loss == 3.4028235e+38) && (!NAN(min_loss))) {
      pwVar9 = (losses->cs).costs._begin;
      lVar13 = (long)(losses->cs).costs._end - (long)pwVar9;
      if (lVar13 != 0) {
        lVar13 = lVar13 >> 4;
        lVar13 = lVar13 + (ulong)(lVar13 == 0);
        do {
          if (pwVar9->x <= min_loss) {
            min_loss = pwVar9->x;
          }
          pwVar9 = pwVar9 + 1;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
    }
    pwVar9 = (losses->cs).costs._begin;
    if ((losses->cs).costs._end != pwVar9) {
      lVar13 = 0;
      uVar15 = 0;
      do {
        *(float *)((long)&pwVar9->x + lVar13) = *(float *)((long)&pwVar9->x + lVar13) - min_loss;
        uVar15 = uVar15 + 1;
        pwVar9 = (losses->cs).costs._begin;
        lVar13 = lVar13 + 0x10;
      } while (uVar15 < (ulong)((long)(losses->cs).costs._end - (long)pwVar9 >> 4));
    }
  }
  else {
    if ((min_loss == 3.4028235e+38) && (!NAN(min_loss))) {
      pwVar9 = (losses->cs).costs._begin;
      lVar13 = (long)(losses->cs).costs._end - (long)pwVar9;
      if (lVar13 != 0) {
        lVar13 = lVar13 >> 4;
        lVar13 = lVar13 + (ulong)(lVar13 == 0);
        do {
          if (pwVar9->x <= min_loss) {
            min_loss = pwVar9->x;
          }
          pwVar9 = pwVar9 + 1;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
    }
    pwVar9 = (losses->cs).costs._begin;
    if ((losses->cs).costs._end != pwVar9) {
      lVar13 = 0;
      uVar15 = 0;
      do {
        *(float *)((long)&pwVar9->x + lVar13) =
             (*(float *)((long)&pwVar9->x + lVar13) - min_loss) * weight;
        uVar15 = uVar15 + 1;
        pwVar9 = (losses->cs).costs._begin;
        lVar13 = lVar13 + 0x10;
      } while (uVar15 < (ulong)((long)(losses->cs).costs._end - (long)pwVar9 >> 4));
    }
  }
  peVar3 = priv->learn_ec_ref;
  if (priv->is_ldf == false) {
    local_78 = (peVar3->l).cb_eval.event.costs.erase_count;
    local_98 = (peVar3->l).multi;
    lStack_90 = (label_t)(peVar3->l).cs.costs._end;
    local_88 = (label_t)(peVar3->l).cs.costs.end_array;
    sStack_80 = (peVar3->l).cs.costs.erase_count;
    pwVar9 = (losses->cs).costs._end;
    pwVar5 = (losses->cs).costs.end_array;
    sVar6 = (losses->cs).costs.erase_count;
    (peVar3->l).multi = losses->multi;
    (peVar3->l).cs.costs._end = pwVar9;
    (peVar3->l).cs.costs.end_array = pwVar5;
    (peVar3->l).cs.costs.erase_count = sVar6;
    (peVar3->l).cb_eval.event.costs.erase_count = (losses->cb_eval).event.costs.erase_count;
    if (add_conditioning) {
      add_example_conditioning
                (priv,peVar3,
                 (long)(priv->learn_condition_on)._end - (long)(priv->learn_condition_on)._begin >>
                 2,(priv->learn_condition_on_names)._begin,(priv->learn_condition_on_act)._begin);
    }
    uVar15 = (ulong)priv->xv;
    uVar21 = 0xffffffffffffffff;
    do {
      uVar17 = priv->current_policy;
      if (-1 < (int)uVar17) {
        iVar18 = (int)priv->learn_learner_id;
        if (((uVar15 & 1) != 0) && (iVar18 = iVar18 * 3, uVar21 == 0xffffffffffffffff)) {
          iVar18 = iVar18 - ((uint)priv->all->sd->example_number | 0xfffffffe);
        }
        uVar17 = iVar18 + uVar17 * (int)priv->num_learners;
      }
      peVar3->in_use = true;
      psVar12 = LEARNER::as_singleline<char,char>(priv->base_learner);
      puVar1 = &(peVar3->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + (ulong)(*(int *)(psVar12 + 0xe0) * uVar17);
      psVar20 = *(search_private **)(psVar12 + 0x18);
      (**(code **)(psVar12 + 0x28))(psVar20,*(undefined8 *)(psVar12 + 0x20),peVar3);
      puVar1 = &(peVar3->super_example_predict).ft_offset;
      *puVar1 = *puVar1 - (ulong)(uVar17 * *(int *)(psVar12 + 0xe0));
      uVar15 = (ulong)priv->xv;
      uVar21 = uVar21 + 1;
    } while (uVar21 < uVar15);
    if (((add_conditioning) &&
        (puVar4 = (peVar3->super_example_predict).indices._end,
        puVar4 != (peVar3->super_example_predict).indices._begin)) && (puVar4[-1] == 0x86)) {
      del_features_in_top_namespace(psVar20,peVar3,0x86);
    }
    (peVar3->l).cb_eval.event.costs.erase_count = local_78;
    (peVar3->l).cs.costs.end_array = (wclass *)local_88;
    (peVar3->l).cs.costs.erase_count = sStack_80;
    (peVar3->l).multi = local_98;
    (peVar3->l).cs.costs._end = (wclass *)lStack_90;
    priv->total_examples_generated = priv->total_examples_generated + 1;
  }
  else {
    bVar8 = COST_SENSITIVE::ec_is_example_header(peVar3);
    uVar15 = (ulong)bVar8;
    if ((add_conditioning) && (uVar15 < priv->learn_ec_ref_cnt)) {
      uVar16 = (uint)bVar8;
      uVar21 = uVar15;
      do {
        uVar16 = uVar16 + 1;
        add_example_conditioning
                  (priv,priv->learn_ec_ref + uVar21,
                   (long)(priv->learn_condition_on)._end - (long)(priv->learn_condition_on)._begin
                   >> 2,(priv->learn_condition_on_names)._begin,
                   (priv->learn_condition_on_act)._begin);
        uVar21 = (ulong)uVar16;
      } while (uVar21 < priv->learn_ec_ref_cnt);
    }
    uVar14 = (ulong)priv->xv;
    uVar16 = (uint)bVar8;
    local_60 = (ulong)(uVar16 + 1);
    uVar21 = 0;
    local_48 = uVar15 * 0x68d0;
    uVar22 = uVar15;
    local_70 = uVar15;
    do {
      uVar19 = priv->current_policy;
      if (-1 < (int)uVar19) {
        iVar18 = (int)priv->learn_learner_id;
        if (((uVar14 & 1) != 0) && (iVar18 = iVar18 * 3, uVar21 == 0)) {
          iVar18 = iVar18 - ((uint)priv->all->sd->example_number | 0xfffffffe);
        }
        uVar19 = iVar18 + uVar19 * (int)priv->num_learners;
      }
      local_38 = (ulong)uVar19;
      local_98.label = 0;
      local_98.weight = 0.0;
      lStack_90.label = 0;
      lStack_90.weight = 0.0;
      local_88.label = 0;
      local_88.weight = 0.0;
      if (uVar15 < priv->learn_ec_ref_cnt) {
        local_68 = *(uint64_t *)
                    ((long)&(priv->learn_ec_ref->super_example_predict).ft_offset + local_48);
      }
      else {
        local_68 = 0;
      }
      local_40 = uVar21;
      if (uVar22 < priv->learn_ec_ref_cnt) {
        uVar19 = 0;
        uVar21 = local_70;
        do {
          peVar3 = priv->learn_ec_ref;
          if (peVar3[uVar21].l.cs.costs._end == peVar3[uVar21].l.cs.costs._begin) {
            local_58._0_8_ = (ulong)uVar19 << 0x20;
            local_58.partial_prediction = 0.0;
            local_58.wap_value = 0.0;
            v_array<COST_SENSITIVE::wclass>::push_back
                      ((v_array<COST_SENSITIVE::wclass> *)&peVar3[uVar21].l.simple,&local_58);
          }
          local_58._0_8_ = peVar3 + uVar21;
          ((((example *)local_58._0_8_)->l).cs.costs._begin)->x =
               (losses->cs).costs._begin[uVar21 - uVar15].x;
          ((example *)local_58._0_8_)->in_use = true;
          (((example *)local_58._0_8_)->super_example_predict).ft_offset = priv->offset;
          if (lStack_90 == local_88) {
            std::vector<example*,std::allocator<example*>>::_M_realloc_insert<example*>
                      ((vector<example*,std::allocator<example*>> *)&local_98,(iterator)lStack_90,
                       (example **)&local_58);
          }
          else {
            *(undefined8 *)lStack_90 = local_58._0_8_;
            lStack_90 = (label_t)((long)lStack_90 + 8);
          }
          priv->total_examples_generated = priv->total_examples_generated + 1;
          uVar21 = (ulong)((int)local_60 + uVar19);
          uVar19 = uVar19 + 1;
        } while (uVar21 < priv->learn_ec_ref_cnt);
      }
      pmVar10 = LEARNER::as_multiline<char,char>(priv->base_learner);
      iVar18 = (int)local_38;
      if (local_98 != lStack_90) {
        iVar2 = *(int *)(pmVar10 + 0xe0);
        lVar11 = local_98;
        do {
          *(ulong *)(*(long *)lVar11 + 0x6820) =
               *(long *)(*(long *)lVar11 + 0x6820) + (ulong)(uint)(iVar2 * (int)local_38);
          lVar11 = (label_t)((long)lVar11 + 8);
        } while (lVar11 != lStack_90);
      }
      (**(code **)(pmVar10 + 0x28))
                (*(undefined8 *)(pmVar10 + 0x18),*(undefined8 *)(pmVar10 + 0x20),&local_98);
      uVar7 = local_40;
      uVar22 = local_70;
      if (local_98 != lStack_90) {
        iVar2 = *(int *)(pmVar10 + 0xe0);
        lVar11 = local_98;
        do {
          *(ulong *)(*(long *)lVar11 + 0x6820) =
               *(long *)(*(long *)lVar11 + 0x6820) - (ulong)(uint)(iVar18 * iVar2);
          lVar11 = (label_t)((long)lVar11 + 8);
        } while (lVar11 != lStack_90);
      }
      uVar21 = local_60;
      uVar14 = uVar15;
      if (uVar15 < priv->learn_ec_ref_cnt) {
        do {
          priv->learn_ec_ref[uVar14].super_example_predict.ft_offset = local_68;
          uVar14 = uVar21 & 0xffffffff;
          uVar21 = (ulong)((int)uVar21 + 1);
        } while (uVar14 < priv->learn_ec_ref_cnt);
      }
      lVar11 = local_98;
      if (local_98 != (label_t)0x0) {
        operator_delete((void *)local_98);
      }
      uVar21 = uVar7 + 1;
      uVar14 = (ulong)priv->xv;
    } while (uVar7 < uVar14);
    if ((add_conditioning) && (uVar22 < priv->learn_ec_ref_cnt)) {
      do {
        uVar16 = uVar16 + 1;
        local_a8 = (ulong)uVar16;
        peVar3 = priv->learn_ec_ref;
        puVar4 = peVar3[uVar22].super_example_predict.indices._end;
        if ((puVar4 != peVar3[uVar22].super_example_predict.indices._begin) && (puVar4[-1] == 0x86))
        {
          del_features_in_top_namespace((search_private *)lVar11,peVar3 + uVar22,0x86);
        }
        uVar22 = local_a8;
      } while (local_a8 < priv->learn_ec_ref_cnt);
    }
  }
  return;
}

Assistant:

void generate_training_example(search_private& priv, polylabel& losses, float weight, bool add_conditioning = true,
    float min_loss = FLT_MAX)  // min_loss = FLT_MAX means "please compute it for me as the actual min"; any other value
                               // means to use this
{
  // should we really subtract out min-loss?
  // float min_loss = FLT_MAX;
  if (priv.cb_learner)
  {
    if (min_loss == FLT_MAX)
      for (size_t i = 0; i < losses.cb.costs.size(); i++) min_loss = MIN(min_loss, losses.cb.costs[i].cost);
    for (size_t i = 0; i < losses.cb.costs.size(); i++) losses.cb.costs[i].cost = losses.cb.costs[i].cost - min_loss;
  }
  else
  {
    if (min_loss == FLT_MAX)
      for (size_t i = 0; i < losses.cs.costs.size(); i++) min_loss = MIN(min_loss, losses.cs.costs[i].x);
    for (size_t i = 0; i < losses.cs.costs.size(); i++)
      losses.cs.costs[i].x = (losses.cs.costs[i].x - min_loss) * weight;
  }
  // cerr << "losses = ["; for (size_t i=0; i<losses.cs.costs.size(); i++) cerr << ' ' << losses.cs.costs[i].class_index
  // << ':' << losses.cs.costs[i].x; cerr << " ]" << endl;

  if (!priv.is_ldf)  // not LDF
  {
    // since we're not LDF, it should be the case that ec_ref_cnt == 1
    // and learn_ec_ref[0] is a pointer to a single example
    assert(priv.learn_ec_ref_cnt == 1);
    assert(priv.learn_ec_ref != nullptr);

    example& ec = priv.learn_ec_ref[0];
    polylabel old_label = ec.l;
    ec.l = losses;  // labels;
    if (add_conditioning)
      add_example_conditioning(priv, ec, priv.learn_condition_on.size(), priv.learn_condition_on_names.begin(),
          priv.learn_condition_on_act.begin());
    for (size_t is_local = 0; is_local <= (size_t)priv.xv; is_local++)
    {
      int learner = select_learner(priv, priv.current_policy, priv.learn_learner_id, true, is_local > 0);
      ec.in_use = true;
      cdbg << "BEGIN base_learner->learn(ec, " << learner << ")" << endl;
      as_singleline(priv.base_learner)->learn(ec, learner);
      cdbg << "END   base_learner->learn(ec, " << learner << ")" << endl;
    }
    if (add_conditioning)
      del_example_conditioning(priv, ec);
    ec.l = old_label;
    priv.total_examples_generated++;
  }
  else  // is  LDF
  {
    assert(cs_get_costs_size(priv.cb_learner, losses) == priv.learn_ec_ref_cnt);
    size_t start_K = (priv.is_ldf && COST_SENSITIVE::ec_is_example_header(priv.learn_ec_ref[0])) ? 1 : 0;

    // TODO: weight
    if (add_conditioning)
      for (action a = (uint32_t)start_K; a < priv.learn_ec_ref_cnt; a++)
      {
        example& ec = priv.learn_ec_ref[a];
        add_example_conditioning(priv, ec, priv.learn_condition_on.size(), priv.learn_condition_on_names.begin(),
            priv.learn_condition_on_act.begin());
      }

    for (size_t is_local = 0; is_local <= (size_t)priv.xv; is_local++)
    {
      int learner = select_learner(priv, priv.current_policy, priv.learn_learner_id, true, is_local > 0);

      // create an example collection for

      multi_ex tmp;
      uint64_t tmp_offset = 0;
      if (priv.learn_ec_ref_cnt > start_K)
        tmp_offset = priv.learn_ec_ref[start_K].ft_offset;
      for (action a = (uint32_t)start_K; a < priv.learn_ec_ref_cnt; a++)
      {
        example& ec = priv.learn_ec_ref[a];
        CS::label& lab = ec.l.cs;
        if (lab.costs.size() == 0)
        {
          CS::wclass wc = {0., a - (uint32_t)start_K, 0., 0.};
          lab.costs.push_back(wc);
        }
        lab.costs[0].x = losses.cs.costs[a - start_K].x;
        ec.in_use = true;
        // store the offset to restore it later
        ec.ft_offset = priv.offset;
        // create the example collection used to learn
        tmp.push_back(&ec);
        cdbg << "generate_training_example called learn on action a=" << a << ", costs.size=" << lab.costs.size()
             << " ec=" << &ec << endl;
        priv.total_examples_generated++;
      }

      // learn with the multiline example
      as_multiline(priv.base_learner)->learn(tmp, learner);

      // restore the offsets in examples
      int i = 0;
      for (action a = (uint32_t)start_K; a < priv.learn_ec_ref_cnt; a++, i++)
        priv.learn_ec_ref[a].ft_offset = tmp_offset;
    }

    if (add_conditioning)
      for (action a = (uint32_t)start_K; a < priv.learn_ec_ref_cnt; a++)
      {
        example& ec = priv.learn_ec_ref[a];
        del_example_conditioning(priv, ec);
      }
  }
}